

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::ByteSize(Message *message)

{
  pointer ppFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Descriptor *this;
  undefined4 extraout_var;
  MessageOptions *pMVar6;
  size_type sVar7;
  reference ppFVar8;
  size_t sVar9;
  UnknownFieldSet *pUVar10;
  int local_5c;
  FieldDescriptor *pFStack_58;
  int i_1;
  int local_50;
  int i;
  undefined1 local_40 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  size_t our_size;
  Reflection *message_reflection;
  Descriptor *descriptor;
  Message *message_local;
  long *plVar5;
  
  this = Message::GetDescriptor(message);
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_40);
  pMVar6 = Descriptor::options(this);
  bVar2 = MessageOptions::map_entry(pMVar6);
  if (bVar2) {
    for (local_50 = 0; iVar3 = local_50, iVar4 = Descriptor::field_count(this), iVar3 < iVar4;
        local_50 = local_50 + 1) {
      pFStack_58 = Descriptor::field(this,local_50);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)local_40,&stack0xffffffffffffffa8);
    }
  }
  else {
    (**(code **)(*plVar5 + 0x80))(plVar5,message,local_40);
  }
  for (local_5c = 0;
      sVar7 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)local_40), (ulong)(long)local_5c < sVar7; local_5c = local_5c + 1) {
    ppFVar8 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            *)local_40,(long)local_5c);
    sVar9 = FieldByteSize(*ppFVar8,message);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(sVar9 + (long)fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  pMVar6 = Descriptor::options(this);
  bVar2 = MessageOptions::message_set_wire_format(pMVar6);
  if (bVar2) {
    pUVar10 = (UnknownFieldSet *)(**(code **)(*plVar5 + 0x10))(plVar5,message);
    sVar9 = ComputeUnknownMessageSetItemsSize(pUVar10);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(sVar9 + (long)fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    pUVar10 = (UnknownFieldSet *)(**(code **)(*plVar5 + 0x10))(plVar5,message);
    sVar9 = ComputeUnknownFieldsSize(pUVar10);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(sVar9 + (long)fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  ppFVar1 = fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_40);
  return (size_t)ppFVar1;
}

Assistant:

size_t WireFormat::ByteSize(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  size_t our_size = 0;

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (int i = 0; i < fields.size(); i++) {
    our_size += FieldByteSize(fields[i], message);
  }

  if (descriptor->options().message_set_wire_format()) {
    our_size += ComputeUnknownMessageSetItemsSize(
      message_reflection->GetUnknownFields(message));
  } else {
    our_size += ComputeUnknownFieldsSize(
      message_reflection->GetUnknownFields(message));
  }

  return our_size;
}